

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O0

int IDAGetCurrentY(void *ida_mem,N_Vector *ycur)

{
  undefined8 *in_RSI;
  long in_RDI;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x50e,"IDAGetCurrentY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    *in_RSI = *(undefined8 *)(in_RDI + 0x280);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDAGetCurrentY(void* ida_mem, N_Vector* ycur)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  *ycur = IDA_mem->ida_yy;

  return (IDA_SUCCESS);
}